

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O1

size_t __thiscall sentencepiece::SelfTestData::ByteSizeLong(SelfTestData *this)

{
  Rep *pRVar1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  void **ppvVar7;
  long lVar8;
  long lVar9;
  
  sVar5 = google::protobuf::internal::ExtensionSet::ByteSize(&this->_extensions_);
  lVar9 = (long)(this->samples_).super_RepeatedPtrFieldBase.current_size_;
  sVar5 = sVar5 + lVar9;
  pRVar1 = (this->samples_).super_RepeatedPtrFieldBase.rep_;
  ppvVar7 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar7 = (void **)0x0;
  }
  if (lVar9 != 0) {
    lVar8 = 0;
    do {
      sVar6 = SelfTestData_Sample::ByteSizeLong(*(SelfTestData_Sample **)((long)ppvVar7 + lVar8));
      uVar4 = (uint)sVar6 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar5 = sVar5 + sVar6 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      lVar8 = lVar8 + 8;
    } while (lVar9 * 8 != lVar8);
  }
  pvVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    sVar5 = sVar5 + *(long *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict1)sVar5;
  return sVar5;
}

Assistant:

size_t SelfTestData::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:sentencepiece.SelfTestData)
  size_t total_size = 0;

  total_size += _extensions_.ByteSize();

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .sentencepiece.SelfTestData.Sample samples = 1;
  total_size += 1UL * this->_internal_samples_size();
  for (const auto& msg : this->samples_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}